

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3Fts5HashWrite
              (Fts5Hash *pHash,i64 iRowid,int iCol,int iPos,char bByte,char *pToken,int nToken)

{
  long lVar1;
  int iVar2;
  Fts5HashEntry **ppFVar3;
  Fts5HashEntry *pFVar4;
  bool bVar5;
  u64 nBytes;
  uint uVar6;
  int iVar7;
  int iVar8;
  size_t __n;
  long lVar9;
  Fts5HashEntry *pFVar10;
  Fts5HashEntry **__s;
  size_t sVar11;
  Fts5HashEntry *pFVar12;
  Fts5HashEntry *pFVar13;
  uint uVar14;
  ulong uVar15;
  Fts5HashEntry *p;
  Fts5HashEntry **apOld;
  long lVar16;
  bool bVar17;
  int local_6c;
  
  bVar17 = pHash->eDetail == 0;
  uVar14 = pHash->nSlot;
  if (nToken < 1) {
    uVar6 = 0xd;
  }
  else {
    uVar15 = (ulong)(uint)nToken + 1;
    uVar6 = 0xd;
    do {
      uVar6 = uVar6 * 8 ^ uVar6 ^ (uint)(byte)pToken[uVar15 - 2];
      uVar15 = uVar15 - 1;
    } while (1 < uVar15);
  }
  uVar15 = (ulong)(uVar6 << 3 ^ (byte)bByte ^ uVar6) % (ulong)uVar14;
  ppFVar3 = pHash->aSlot;
  pFVar10 = ppFVar3[uVar15];
  __n = (size_t)nToken;
  if (pFVar10 != (Fts5HashEntry *)0x0) {
LAB_001d3e68:
    if (((*(char *)&pFVar10[1].pHashNext != bByte) || (pFVar10->nKey != nToken)) ||
       (iVar7 = bcmp((void *)((long)&pFVar10[1].pHashNext + 1),pToken,__n), iVar7 != 0))
    goto LAB_001d3e99;
    iVar7 = pFVar10->nAlloc;
    iVar8 = pFVar10->nData;
    if (iVar7 - iVar8 < 0x16) {
      iVar8 = sqlite3_initialize();
      if (iVar8 != 0) {
        return 7;
      }
      nBytes = (long)iVar7 * 2;
      pFVar12 = (Fts5HashEntry *)sqlite3Realloc(pFVar10,nBytes);
      if (pFVar12 == (Fts5HashEntry *)0x0) {
        return 7;
      }
      pFVar12->nAlloc = (int)nBytes;
      pFVar4 = (Fts5HashEntry *)(pHash->aSlot + uVar15);
      do {
        pFVar13 = pFVar4;
        pFVar4 = pFVar13->pHashNext;
      } while (pFVar4 != pFVar10);
      pFVar13->pHashNext = pFVar12;
      iVar8 = pFVar12->nData;
      pFVar10 = pFVar12;
    }
    iVar7 = -iVar8;
    if (pFVar10->iRowid != iRowid) {
      fts5HashAddPoslistSize(pHash,pFVar10,(Fts5HashEntry *)0x0);
      iVar8 = sqlite3Fts5PutVarint
                        ((uchar *)((long)&pFVar10->pHashNext + (long)pFVar10->nData),
                         iRowid - pFVar10->iRowid);
      iVar8 = iVar8 + pFVar10->nData;
      pFVar10->nData = iVar8;
      pFVar10->iRowid = iRowid;
      pFVar10->iSzPoslist = iVar8;
      iVar2 = pHash->eDetail;
      bVar17 = true;
      if (iVar2 != 1) {
        pFVar10->nData = iVar8 + 1;
        pFVar10->iCol = -(ushort)(iVar2 != 0);
        pFVar10->iPos = 0;
        iVar8 = iVar8 + 1;
      }
    }
    goto LAB_001d4196;
  }
LAB_001d3ea1:
  lVar1 = __n + 1;
  lVar9 = 0xf;
  if (0xf < lVar1) {
    lVar9 = lVar1;
  }
  if ((int)uVar14 <= pHash->nEntry * 2) {
    iVar7 = sqlite3_initialize();
    if (iVar7 != 0) {
      return 7;
    }
    __s = (Fts5HashEntry **)sqlite3Malloc((long)(int)uVar14 << 4);
    if (__s == (Fts5HashEntry **)0x0) {
      return 7;
    }
    uVar6 = uVar14 * 2;
    memset(__s,0,(long)(int)uVar14 << 4);
    iVar7 = pHash->nSlot;
    if (0 < (long)iVar7) {
      lVar16 = 0;
      do {
        while (pFVar10 = ppFVar3[lVar16], pFVar10 != (Fts5HashEntry *)0x0) {
          ppFVar3[lVar16] = pFVar10->pHashNext;
          sVar11 = strlen((char *)(pFVar10 + 1));
          if ((int)(uint)sVar11 < 1) {
            uVar14 = 0xd;
          }
          else {
            uVar14 = 0xd;
            uVar15 = (ulong)((uint)sVar11 & 0x7fffffff);
            do {
              uVar14 = uVar14 * 8 ^ uVar14 ^ (uint)*(byte *)((long)&pFVar10->iRowid + uVar15 + 7);
              bVar5 = 1 < uVar15;
              uVar15 = uVar15 - 1;
            } while (bVar5);
          }
          pFVar10->pHashNext = __s[(ulong)uVar14 % (ulong)uVar6];
          __s[(ulong)uVar14 % (ulong)uVar6] = pFVar10;
        }
        lVar16 = lVar16 + 1;
      } while (lVar16 != iVar7);
    }
    sqlite3_free(ppFVar3);
    pHash->nSlot = uVar6;
    pHash->aSlot = __s;
    if (nToken < 1) {
      uVar14 = 0xd;
    }
    else {
      uVar15 = (ulong)(uint)nToken + 1;
      uVar14 = 0xd;
      do {
        uVar14 = uVar14 * 8 ^ uVar14 ^ (uint)(byte)pToken[uVar15 - 2];
        uVar15 = uVar15 - 1;
      } while (1 < uVar15);
    }
    uVar15 = (ulong)(uVar14 << 3 ^ (byte)bByte ^ uVar14) % (ulong)uVar6;
  }
  iVar7 = sqlite3_initialize();
  if (iVar7 != 0) {
    return 7;
  }
  pFVar10 = (Fts5HashEntry *)sqlite3Malloc(lVar9 + 0x71U);
  if (pFVar10 == (Fts5HashEntry *)0x0) {
    return 7;
  }
  pFVar10->nAlloc = 0;
  pFVar10->iSzPoslist = 0;
  pFVar10->nData = 0;
  pFVar10->nKey = 0;
  pFVar10->bDel = '\0';
  pFVar10->bContent = '\0';
  pFVar10->iCol = 0;
  pFVar10->iPos = 0;
  pFVar10->iRowid = 0;
  pFVar10->pHashNext = (Fts5HashEntry *)0x0;
  pFVar10->pScanNext = (Fts5HashEntry *)0x0;
  pFVar10->nAlloc = (int)(lVar9 + 0x71U);
  *(char *)&pFVar10[1].pHashNext = bByte;
  memcpy((void *)((long)&pFVar10[1].pHashNext + 1),pToken,__n);
  pFVar10->nKey = nToken;
  *(undefined1 *)((long)&pFVar10[1].pHashNext + lVar1) = 0;
  pFVar10->nData = nToken + 0x32;
  ppFVar3 = pHash->aSlot;
  pFVar10->pHashNext = ppFVar3[uVar15];
  ppFVar3[uVar15] = pFVar10;
  pHash->nEntry = pHash->nEntry + 1;
  iVar7 = sqlite3Fts5PutVarint((uchar *)((long)&pFVar10->pHashNext + (long)(nToken + 0x32)),iRowid);
  iVar7 = iVar7 + pFVar10->nData;
  pFVar10->nData = iVar7;
  pFVar10->iRowid = iRowid;
  pFVar10->iSzPoslist = iVar7;
  iVar2 = pHash->eDetail;
  iVar8 = iVar7;
  if (iVar2 != 1) {
    iVar7 = iVar7 + 1;
    pFVar10->nData = iVar7;
    pFVar10->iCol = -(ushort)(iVar2 != 0);
    iVar8 = iVar7;
  }
LAB_001d4196:
  if (iCol < 0) {
    pFVar10->bDel = '\x01';
    goto LAB_001d4252;
  }
  if (pHash->eDetail == 1) {
    pFVar10->bContent = '\x01';
    goto LAB_001d4252;
  }
  if (pFVar10->iCol == iCol) {
LAB_001d4224:
    local_6c = iPos;
    if (!bVar17) goto LAB_001d4252;
  }
  else {
    if (pHash->eDetail == 0) {
      pFVar10->nData = iVar8 + 1;
      *(undefined1 *)((long)&pFVar10->pHashNext + (long)iVar8) = 1;
      iVar8 = sqlite3Fts5PutVarint
                        ((uchar *)((long)&pFVar10->pHashNext + (long)pFVar10->nData),
                         (ulong)(uint)iCol);
      iVar8 = iVar8 + pFVar10->nData;
      pFVar10->nData = iVar8;
      pFVar10->iCol = (i16)iCol;
      pFVar10->iPos = 0;
      goto LAB_001d4224;
    }
    pFVar10->iCol = (i16)iCol;
    local_6c = iCol;
  }
  iVar8 = sqlite3Fts5PutVarint
                    ((uchar *)((long)&pFVar10->pHashNext + (long)iVar8),
                     (long)((local_6c - pFVar10->iPos) + 2));
  iVar8 = iVar8 + pFVar10->nData;
  pFVar10->nData = iVar8;
  pFVar10->iPos = local_6c;
LAB_001d4252:
  *pHash->pnByte = *pHash->pnByte + iVar8 + iVar7;
  return 0;
LAB_001d3e99:
  pFVar10 = pFVar10->pHashNext;
  if (pFVar10 == (Fts5HashEntry *)0x0) goto LAB_001d3ea1;
  goto LAB_001d3e68;
}

Assistant:

static int sqlite3Fts5HashWrite(
  Fts5Hash *pHash,
  i64 iRowid,                     /* Rowid for this entry */
  int iCol,                       /* Column token appears in (-ve -> delete) */
  int iPos,                       /* Position of token within column */
  char bByte,                     /* First byte of token */
  const char *pToken, int nToken  /* Token to add or remove to or from index */
){
  unsigned int iHash;
  Fts5HashEntry *p;
  u8 *pPtr;
  int nIncr = 0;                  /* Amount to increment (*pHash->pnByte) by */
  int bNew;                       /* If non-delete entry should be written */
  
  bNew = (pHash->eDetail==FTS5_DETAIL_FULL);

  /* Attempt to locate an existing hash entry */
  iHash = fts5HashKey2(pHash->nSlot, (u8)bByte, (const u8*)pToken, nToken);
  for(p=pHash->aSlot[iHash]; p; p=p->pHashNext){
    char *zKey = fts5EntryKey(p);
    if( zKey[0]==bByte 
     && p->nKey==nToken
     && memcmp(&zKey[1], pToken, nToken)==0 
    ){
      break;
    }
  }

  /* If an existing hash entry cannot be found, create a new one. */
  if( p==0 ){
    /* Figure out how much space to allocate */
    char *zKey;
    sqlite3_int64 nByte = sizeof(Fts5HashEntry) + (nToken+1) + 1 + 64;
    if( nByte<128 ) nByte = 128;

    /* Grow the Fts5Hash.aSlot[] array if necessary. */
    if( (pHash->nEntry*2)>=pHash->nSlot ){
      int rc = fts5HashResize(pHash);
      if( rc!=SQLITE_OK ) return rc;
      iHash = fts5HashKey2(pHash->nSlot, (u8)bByte, (const u8*)pToken, nToken);
    }

    /* Allocate new Fts5HashEntry and add it to the hash table. */
    p = (Fts5HashEntry*)sqlite3_malloc64(nByte);
    if( !p ) return SQLITE_NOMEM;
    memset(p, 0, sizeof(Fts5HashEntry));
    p->nAlloc = (int)nByte;
    zKey = fts5EntryKey(p);
    zKey[0] = bByte;
    memcpy(&zKey[1], pToken, nToken);
    assert( iHash==fts5HashKey(pHash->nSlot, (u8*)zKey, nToken+1) );
    p->nKey = nToken;
    zKey[nToken+1] = '\0';
    p->nData = nToken+1 + 1 + sizeof(Fts5HashEntry);
    p->pHashNext = pHash->aSlot[iHash];
    pHash->aSlot[iHash] = p;
    pHash->nEntry++;

    /* Add the first rowid field to the hash-entry */
    p->nData += sqlite3Fts5PutVarint(&((u8*)p)[p->nData], iRowid);
    p->iRowid = iRowid;

    p->iSzPoslist = p->nData;
    if( pHash->eDetail!=FTS5_DETAIL_NONE ){
      p->nData += 1;
      p->iCol = (pHash->eDetail==FTS5_DETAIL_FULL ? 0 : -1);
    }

    nIncr += p->nData;
  }else{

    /* Appending to an existing hash-entry. Check that there is enough 
    ** space to append the largest possible new entry. Worst case scenario 
    ** is:
    **
    **     + 9 bytes for a new rowid,
    **     + 4 byte reserved for the "poslist size" varint.
    **     + 1 byte for a "new column" byte,
    **     + 3 bytes for a new column number (16-bit max) as a varint,
    **     + 5 bytes for the new position offset (32-bit max).
    */
    if( (p->nAlloc - p->nData) < (9 + 4 + 1 + 3 + 5) ){
      sqlite3_int64 nNew = p->nAlloc * 2;
      Fts5HashEntry *pNew;
      Fts5HashEntry **pp;
      pNew = (Fts5HashEntry*)sqlite3_realloc64(p, nNew);
      if( pNew==0 ) return SQLITE_NOMEM;
      pNew->nAlloc = (int)nNew;
      for(pp=&pHash->aSlot[iHash]; *pp!=p; pp=&(*pp)->pHashNext);
      *pp = pNew;
      p = pNew;
    }
    nIncr -= p->nData;
  }
  assert( (p->nAlloc - p->nData) >= (9 + 4 + 1 + 3 + 5) );

  pPtr = (u8*)p;

  /* If this is a new rowid, append the 4-byte size field for the previous
  ** entry, and the new rowid for this entry.  */
  if( iRowid!=p->iRowid ){
    fts5HashAddPoslistSize(pHash, p, 0);
    p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iRowid - p->iRowid);
    p->iRowid = iRowid;
    bNew = 1;
    p->iSzPoslist = p->nData;
    if( pHash->eDetail!=FTS5_DETAIL_NONE ){
      p->nData += 1;
      p->iCol = (pHash->eDetail==FTS5_DETAIL_FULL ? 0 : -1);
      p->iPos = 0;
    }
  }

  if( iCol>=0 ){
    if( pHash->eDetail==FTS5_DETAIL_NONE ){
      p->bContent = 1;
    }else{
      /* Append a new column value, if necessary */
      assert( iCol>=p->iCol );
      if( iCol!=p->iCol ){
        if( pHash->eDetail==FTS5_DETAIL_FULL ){
          pPtr[p->nData++] = 0x01;
          p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iCol);
          p->iCol = (i16)iCol;
          p->iPos = 0;
        }else{
          bNew = 1;
          p->iCol = (i16)(iPos = iCol);
        }
      }

      /* Append the new position offset, if necessary */
      if( bNew ){
        p->nData += sqlite3Fts5PutVarint(&pPtr[p->nData], iPos - p->iPos + 2);
        p->iPos = iPos;
      }
    }
  }else{
    /* This is a delete. Set the delete flag. */
    p->bDel = 1;
  }

  nIncr += p->nData;
  *pHash->pnByte += nIncr;
  return SQLITE_OK;
}